

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_tcp.cpp
# Opt level: O1

int __thiscall miniros::TransportTCP::listen(TransportTCP *this,int __fd,int __n)

{
  sockaddr_storage *__addr;
  ushort uVar1;
  uint __fd_00;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  undefined4 uVar5;
  socklen_t sVar6;
  undefined8 *puVar7;
  function<void_(const_std::shared_ptr<miniros::TransportTCP>_&)> *in_RCX;
  int iVar8;
  sockaddr_storage *psVar9;
  string *psVar10;
  ulong uVar11;
  _Alloc_hider _Var12;
  string local_40;
  
  this->is_server_ = true;
  std::function<void_(const_std::shared_ptr<miniros::TransportTCP>_&)>::operator=
            (&this->accept_cb_,in_RCX);
  if (s_use_ipv6_ == '\x01') {
    iVar8 = 1;
    iVar4 = socket(10,1,0);
    this->sock_ = iVar4;
    (this->server_address_).ss_family = 10;
    if ((this->super_Transport).only_localhost_allowed_ == false) {
      puVar7 = (undefined8 *)&in6addr_any;
    }
    else {
      puVar7 = (undefined8 *)&in6addr_loopback;
    }
    uVar2 = puVar7[1];
    *(undefined8 *)((this->server_address_).__ss_padding + 6) = *puVar7;
    *(undefined8 *)((this->server_address_).__ss_padding + 0xe) = uVar2;
    sVar6 = 0x1c;
  }
  else {
    iVar8 = 1;
    iVar4 = socket(2,1,0);
    this->sock_ = iVar4;
    (this->server_address_).ss_family = 2;
    uVar5 = 0x100007f;
    if ((this->super_Transport).only_localhost_allowed_ == false) {
      uVar5 = 0;
    }
    *(undefined4 *)((this->server_address_).__ss_padding + 2) = uVar5;
    sVar6 = 0x10;
  }
  *(ushort *)(this->server_address_).__ss_padding = (ushort)__fd << 8 | (ushort)__fd >> 8;
  this->sa_len_ = sVar6;
  __fd_00 = this->sock_;
  _Var12._M_p = (pointer)(ulong)__fd_00;
  if (__fd_00 == 0xffffffff) {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (listen::loc.initialized_ == false) {
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"miniros.transport_tcp","");
      psVar10 = &local_40;
      console::initializeLogLocation(&listen::loc,psVar10,Error);
      iVar8 = (int)psVar10;
      _Var12._M_p = local_40._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        uVar11 = local_40.field_2._M_allocated_capacity + 1;
        operator_delete(local_40._M_dataplus._M_p,uVar11);
        iVar8 = (int)uVar11;
      }
    }
    iVar4 = (int)_Var12._M_p;
    if (listen::loc.level_ != Error) {
      listen(iVar4,iVar8);
    }
    if (listen::loc.logger_enabled_ == true) {
      listen(iVar4,iVar8);
    }
  }
  else {
    __addr = &this->server_address_;
    psVar9 = __addr;
    iVar4 = bind(__fd_00,(sockaddr *)__addr,this->sa_len_);
    iVar8 = (int)psVar9;
    if (iVar4 < 0) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (listen(int,int,std::function<void(std::shared_ptr<miniros::TransportTCP>const&)>const&)::
          loc.initialized_ == false) {
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"miniros.transport_tcp","");
        psVar10 = &local_40;
        console::initializeLogLocation
                  (&listen(int,int,std::function<void(std::shared_ptr<miniros::TransportTCP>const&)>const&)
                    ::loc,psVar10,Error);
        iVar8 = (int)psVar10;
        _Var12._M_p = local_40._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          uVar11 = local_40.field_2._M_allocated_capacity + 1;
          operator_delete(local_40._M_dataplus._M_p,uVar11);
          iVar8 = (int)uVar11;
        }
      }
      iVar4 = (int)_Var12._M_p;
      if (listen(int,int,std::function<void(std::shared_ptr<miniros::TransportTCP>const&)>const&)::
          loc.level_ != Error) {
        listen(iVar4,iVar8);
      }
      if (listen(int,int,std::function<void(std::shared_ptr<miniros::TransportTCP>const&)>const&)::
          loc.logger_enabled_ == true) {
        listen(iVar4,iVar8);
      }
    }
    else {
      ::listen(this->sock_,__n);
      getsockname(this->sock_,(sockaddr *)__addr,&this->sa_len_);
      if (((this->server_address_).ss_family | 8) == 10) {
        uVar1 = *(ushort *)(this->server_address_).__ss_padding;
        this->server_port_ = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8);
      }
      bVar3 = initializeSocket(this);
      if (bVar3) {
        iVar4 = (int)CONCAT71((uint7)(uint3)((uint)__n >> 8),1);
        if ((this->flags_ & 1) != 0) {
          return iVar4;
        }
        (*(this->super_Transport)._vptr_Transport[6])(this);
        return iVar4;
      }
    }
  }
  return 0;
}

Assistant:

bool TransportTCP::listen(int port, int backlog, const AcceptCallback& accept_cb)
{
  is_server_ = true;
  accept_cb_ = accept_cb;

  if (s_use_ipv6_)
  {
    sock_ = socket(AF_INET6, SOCK_STREAM, 0);
    sockaddr_in6 *address = (sockaddr_in6 *)&server_address_;
    address->sin6_family = AF_INET6;
    address->sin6_addr = isOnlyLocalhostAllowed() ? 
                         in6addr_loopback : 
                         in6addr_any;
    address->sin6_port = htons(port);
    sa_len_ = sizeof(sockaddr_in6);
  }
  else
  {
    sock_ = socket(AF_INET, SOCK_STREAM, 0);
    sockaddr_in *address = (sockaddr_in *)&server_address_;
    address->sin_family = AF_INET;
    address->sin_addr.s_addr = isOnlyLocalhostAllowed() ? 
                               htonl(INADDR_LOOPBACK) : 
                               INADDR_ANY;
    address->sin_port = htons(port);
    sa_len_ = sizeof(sockaddr_in);
  }

  if (sock_ == ROS_INVALID_SOCKET)
  {
    MINIROS_ERROR("socket() failed with error [%s]", last_socket_error_string());
    return false;
  }


  if (bind(sock_, (sockaddr *)&server_address_, sa_len_) < 0)
  {
    MINIROS_ERROR("bind() failed with error [%s]", last_socket_error_string());
    return false;
  }

  ::listen(sock_, backlog);
  getsockname(sock_, (sockaddr *)&server_address_, &sa_len_);

  switch (server_address_.ss_family)
  {
    case AF_INET:
      server_port_ = ntohs(((sockaddr_in *)&server_address_)->sin_port);
      break;
    case AF_INET6:
      server_port_ = ntohs(((sockaddr_in6 *)&server_address_)->sin6_port);
      break;
  }

  if (!initializeSocket())
  {
    return false;
  }

  if (!(flags_ & SYNCHRONOUS))
  {
    enableRead();
  }

  return true;
}